

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O3

mraa_result_t i2c_set(int bus,uint8_t device_address,uint8_t register_address,uint8_t data)

{
  mraa_result_t mVar1;
  mraa_result_t mVar2;
  long lVar3;
  undefined4 in_register_0000003c;
  
  lVar3 = mraa_i2c_init(CONCAT44(in_register_0000003c,bus));
  if (lVar3 == 0) {
    mVar1 = MRAA_ERROR_NO_RESOURCES;
  }
  else {
    mVar1 = mraa_i2c_address(lVar3,device_address);
    if (mVar1 == MRAA_SUCCESS) {
      mVar2 = mraa_i2c_write_byte_data(lVar3,data,register_address);
      mVar1 = MRAA_SUCCESS;
      if (mVar2 != MRAA_SUCCESS) {
        fprintf(_stderr,"Could not write to i2c register. Status = %d\n",(ulong)mVar2);
        mVar1 = mVar2;
      }
    }
    else {
      i2c_set_cold_1();
    }
    mraa_i2c_stop(lVar3);
  }
  return mVar1;
}

Assistant:

mraa_result_t
i2c_set(int bus, uint8_t device_address, uint8_t register_address, uint8_t data)
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_i2c_context i2c = mraa_i2c_init(bus);
    if (i2c == NULL) {
        return MRAA_ERROR_NO_RESOURCES;
    }
    status = mraa_i2c_address(i2c, device_address);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Could not set i2c device address\n");
        goto i2c_set_exit;
    }
    status = mraa_i2c_write_byte_data(i2c, data, register_address);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "Could not write to i2c register. Status = %d\n", status);
        goto i2c_set_exit;
    }
i2c_set_exit:
    mraa_i2c_stop(i2c);
    return status;
}